

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O1

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET13_v1::read
          (LASreadItemCompressed_WAVEPACKET13_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  U64 *pUVar15;
  U8 *pUVar16;
  undefined8 uVar17;
  U64 UVar18;
  U64 UVar19;
  U64 UVar20;
  U32 UVar21;
  I32 IVar22;
  I32 IVar23;
  I32 IVar24;
  I32 IVar25;
  I32 IVar26;
  undefined4 in_register_00000034;
  undefined1 *puVar27;
  U64 local_68;
  
  puVar27 = (undefined1 *)CONCAT44(in_register_00000034,__fd);
  UVar21 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_packet_index);
  *puVar27 = (char)UVar21;
  pUVar15 = (U64 *)this->last_item;
  local_68 = *pUVar15;
  UVar18 = pUVar15[1];
  bVar1 = *(byte *)((long)pUVar15 + 0xc);
  bVar2 = *(byte *)((long)pUVar15 + 0xd);
  bVar3 = *(byte *)((long)pUVar15 + 0xe);
  bVar4 = *(byte *)((long)pUVar15 + 0xf);
  UVar19 = pUVar15[2];
  bVar5 = *(byte *)((long)pUVar15 + 0x11);
  bVar6 = *(byte *)((long)pUVar15 + 0x12);
  bVar7 = *(byte *)((long)pUVar15 + 0x13);
  bVar8 = *(byte *)((long)pUVar15 + 0x14);
  bVar9 = *(byte *)((long)pUVar15 + 0x15);
  bVar10 = *(byte *)((long)pUVar15 + 0x16);
  bVar11 = *(byte *)((long)pUVar15 + 0x17);
  UVar20 = pUVar15[3];
  bVar12 = *(byte *)((long)pUVar15 + 0x19);
  bVar13 = *(byte *)((long)pUVar15 + 0x1a);
  bVar14 = *(byte *)((long)pUVar15 + 0x1b);
  UVar21 = ArithmeticDecoder::decodeSymbol
                     (this->dec,this->m_offset_diff[this->sym_last_offset_diff]);
  this->sym_last_offset_diff = UVar21;
  if (UVar21 != 0) {
    if (UVar21 == 2) {
      IVar22 = IntegerCompressor::decompress(this->ic_offset_diff,this->last_diff_32,0);
      this->last_diff_32 = IVar22;
      local_68 = local_68 + (long)IVar22;
    }
    else if (UVar21 == 1) {
      local_68 = local_68 + (uint)UVar18;
    }
    else {
      local_68 = ArithmeticDecoder::readInt64(this->dec);
    }
  }
  IVar22 = IntegerCompressor::decompress(this->ic_packet_size,(uint)UVar18,0);
  IVar23 = IntegerCompressor::decompress
                     (this->ic_return_point,
                      (uint)bVar4 << 0x18 | (uint)bVar3 << 0x10 | (uint)bVar2 * 0x100 + (uint)bVar1,
                      0);
  IVar24 = IntegerCompressor::decompress
                     (this->ic_xyz,
                      (uint)bVar7 << 0x18 |
                      (uint)bVar6 << 0x10 | (uint)bVar5 * 0x100 + (uint)(byte)UVar19,0);
  IVar25 = IntegerCompressor::decompress
                     (this->ic_xyz,
                      (uint)bVar11 << 0x18 |
                      (uint)bVar10 << 0x10 | (uint)bVar9 * 0x100 + (uint)bVar8,1);
  IVar26 = IntegerCompressor::decompress
                     (this->ic_xyz,
                      (uint)bVar14 << 0x18 |
                      (uint)bVar13 << 0x10 | (uint)bVar12 * 0x100 + (uint)(byte)UVar20,2);
  puVar27[1] = (char)local_68;
  puVar27[2] = (char)(local_68 >> 8);
  puVar27[3] = (char)(local_68 >> 0x10);
  puVar27[4] = (char)(local_68 >> 0x18);
  puVar27[5] = (char)(local_68 >> 0x20);
  puVar27[6] = (char)(local_68 >> 0x28);
  puVar27[7] = (char)(local_68 >> 0x30);
  puVar27[8] = (char)(local_68 >> 0x38);
  puVar27[9] = (char)IVar22;
  puVar27[10] = (char)((uint)IVar22 >> 8);
  puVar27[0xb] = (char)((uint)IVar22 >> 0x10);
  puVar27[0xc] = (char)((uint)IVar22 >> 0x18);
  puVar27[0xd] = (char)IVar23;
  puVar27[0xe] = (char)((uint)IVar23 >> 8);
  puVar27[0xf] = (char)((uint)IVar23 >> 0x10);
  puVar27[0x10] = (char)((uint)IVar23 >> 0x18);
  puVar27[0x11] = (char)IVar24;
  puVar27[0x12] = (char)((uint)IVar24 >> 8);
  puVar27[0x13] = (char)((uint)IVar24 >> 0x10);
  puVar27[0x14] = (char)((uint)IVar24 >> 0x18);
  puVar27[0x15] = (char)IVar25;
  puVar27[0x16] = (char)((uint)IVar25 >> 8);
  puVar27[0x17] = (char)((uint)IVar25 >> 0x10);
  puVar27[0x18] = (char)((uint)IVar25 >> 0x18);
  puVar27[0x19] = (char)IVar26;
  puVar27[0x1a] = (char)((uint)IVar26 >> 8);
  puVar27[0x1b] = (char)((uint)IVar26 >> 0x10);
  puVar27[0x1c] = (char)((uint)IVar26 >> 0x18);
  pUVar16 = this->last_item;
  uVar17 = *(undefined8 *)(puVar27 + 0x15);
  *(undefined8 *)(pUVar16 + 0xc) = *(undefined8 *)(puVar27 + 0xd);
  *(undefined8 *)(pUVar16 + 0x14) = uVar17;
  uVar17 = *(undefined8 *)(puVar27 + 9);
  *(undefined8 *)pUVar16 = *(undefined8 *)(puVar27 + 1);
  *(undefined8 *)(pUVar16 + 8) = uVar17;
  return (ssize_t)pUVar16;
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET13_v1::read(U8* item, U32& context)
{
  item[0] = (U8)(dec->decodeSymbol(m_packet_index));
  item++;

  LASwavepacket13 this_item_m;
  LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item);

  sym_last_offset_diff = dec->decodeSymbol(m_offset_diff[sym_last_offset_diff]);

  if (sym_last_offset_diff == 0)
  {
    this_item_m.offset = last_item_m.offset;
  }
  else if (sym_last_offset_diff == 1)
  {
    this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
  }
  else if (sym_last_offset_diff == 2)
  {
    last_diff_32 = ic_offset_diff->decompress(last_diff_32);
    this_item_m.offset = last_item_m.offset + last_diff_32;
  }
  else
  {
    this_item_m.offset = dec->readInt64();
  }

  this_item_m.packet_size = ic_packet_size->decompress(last_item_m.packet_size);
  this_item_m.return_point.i32 = ic_return_point->decompress(last_item_m.return_point.i32);
  this_item_m.x.i32 = ic_xyz->decompress(last_item_m.x.i32, 0);
  this_item_m.y.i32 = ic_xyz->decompress(last_item_m.y.i32, 1);
  this_item_m.z.i32 = ic_xyz->decompress(last_item_m.z.i32, 2);

  this_item_m.pack(item);

  memcpy(last_item, item, 28);
}